

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLINNECK_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000228;
  double *in_stack_00000230;
  double *in_stack_00000238;
  double *in_stack_00000240;
  int in_stack_0000024c;
  int in_stack_00000250;
  int *in_stack_00000260;
  int *in_stack_00000268;
  int *in_stack_00000270;
  
  TVar1 = TA_CDLINNECK(in_stack_00000250,in_stack_0000024c,in_stack_00000240,in_stack_00000238,
                       in_stack_00000230,in_stack_00000228,in_stack_00000260,in_stack_00000268,
                       in_stack_00000270);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLINNECK_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLINNECK(
/* Generated */                   startIdx,
/* Generated */                   endIdx,
/* Generated */                   params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                   params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                   params->in[0].data.inPrice.low, /* inLow */
/* Generated */                   params->in[0].data.inPrice.close, /* inClose */
/* Generated */                   outBegIdx, 
/* Generated */                   outNBElement, 
/* Generated */                   params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }